

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O0

bool __thiscall cmValue::IsOff(cmValue *this,string_view value)

{
  size_type sVar1;
  const_reference pvVar2;
  char *extraout_RDX;
  string_view value_00;
  bool local_41;
  bool local_40;
  bool local_3f;
  bool local_3e;
  bool local_3d;
  bool local_3c;
  bool local_3b;
  bool local_3a;
  bool local_39;
  undefined1 local_20 [8];
  string_view value_local;
  
  value_local._M_len = value._M_len;
  local_20 = (undefined1  [8])this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  switch(sVar1) {
  case 0:
    value_local._M_str._7_1_ = true;
    break;
  case 1:
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
    local_39 = true;
    if (*pvVar2 != '0') {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
      local_39 = true;
      if (*pvVar2 != 'N') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
        local_39 = *pvVar2 == 'n';
      }
    }
    value_local._M_str._7_1_ = local_39;
    break;
  case 2:
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
    if (*pvVar2 == 'N') {
LAB_0013e0c0:
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
      local_3b = true;
      if (*pvVar2 != 'O') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
        local_3b = *pvVar2 == 'o';
      }
      local_3a = local_3b;
    }
    else {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
      local_3a = false;
      if (*pvVar2 == 'n') goto LAB_0013e0c0;
    }
    value_local._M_str._7_1_ = local_3a;
    break;
  case 3:
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
    if (*pvVar2 == 'O') {
LAB_0013e137:
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
      if (*pvVar2 != 'F') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
        local_3c = false;
        if (*pvVar2 != 'f') goto LAB_0013e1a3;
      }
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,2);
      local_3d = true;
      if (*pvVar2 != 'F') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,2);
        local_3d = *pvVar2 == 'f';
      }
      local_3c = local_3d;
    }
    else {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
      local_3c = false;
      if (*pvVar2 == 'o') goto LAB_0013e137;
    }
LAB_0013e1a3:
    value_local._M_str._7_1_ = local_3c;
    break;
  default:
    value_00._M_str = extraout_RDX;
    value_00._M_len = value_local._M_len;
    value_local._M_str._7_1_ = IsNOTFOUND((cmValue *)local_20,value_00);
    break;
  case 5:
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
    if (*pvVar2 == 'F') {
LAB_0013e1e3:
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
      if (*pvVar2 != 'A') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
        local_3e = false;
        if (*pvVar2 != 'a') goto LAB_0013e2b5;
      }
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,2);
      if (*pvVar2 != 'L') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,2);
        local_3e = false;
        if (*pvVar2 != 'l') goto LAB_0013e2b5;
      }
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,3);
      if (*pvVar2 != 'S') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,3);
        local_3e = false;
        if (*pvVar2 != 's') goto LAB_0013e2b5;
      }
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,4);
      local_3f = true;
      if (*pvVar2 != 'E') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,4);
        local_3f = *pvVar2 == 'e';
      }
      local_3e = local_3f;
    }
    else {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
      local_3e = false;
      if (*pvVar2 == 'f') goto LAB_0013e1e3;
    }
LAB_0013e2b5:
    value_local._M_str._7_1_ = local_3e;
    break;
  case 6:
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
    if (*pvVar2 == 'I') {
LAB_0013e2f5:
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
      if (*pvVar2 != 'G') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
        local_40 = false;
        if (*pvVar2 != 'g') goto LAB_0013e3fc;
      }
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,2);
      if (*pvVar2 != 'N') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,2);
        local_40 = false;
        if (*pvVar2 != 'n') goto LAB_0013e3fc;
      }
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,3);
      if (*pvVar2 != 'O') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,3);
        local_40 = false;
        if (*pvVar2 != 'o') goto LAB_0013e3fc;
      }
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,4);
      if (*pvVar2 != 'R') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,4);
        local_40 = false;
        if (*pvVar2 != 'r') goto LAB_0013e3fc;
      }
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,5);
      local_41 = true;
      if (*pvVar2 != 'E') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,5);
        local_41 = *pvVar2 == 'e';
      }
      local_40 = local_41;
    }
    else {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
      local_40 = false;
      if (*pvVar2 == 'i') goto LAB_0013e2f5;
    }
LAB_0013e3fc:
    value_local._M_str._7_1_ = local_40;
  }
  return value_local._M_str._7_1_;
}

Assistant:

bool cmValue::IsOff(cm::string_view value) noexcept
{
  switch (value.size()) {
    case 0:
      return true;
    case 1:
      return value[0] == '0' || value[0] == 'N' || value[0] == 'n';
    case 2:
      return                                    //
        (value[0] == 'N' || value[0] == 'n') && //
        (value[1] == 'O' || value[1] == 'o');
    case 3:
      return                                    //
        (value[0] == 'O' || value[0] == 'o') && //
        (value[1] == 'F' || value[1] == 'f') && //
        (value[2] == 'F' || value[2] == 'f');
    case 5:
      return                                    //
        (value[0] == 'F' || value[0] == 'f') && //
        (value[1] == 'A' || value[1] == 'a') && //
        (value[2] == 'L' || value[2] == 'l') && //
        (value[3] == 'S' || value[3] == 's') && //
        (value[4] == 'E' || value[4] == 'e');
    case 6:
      return                                    //
        (value[0] == 'I' || value[0] == 'i') && //
        (value[1] == 'G' || value[1] == 'g') && //
        (value[2] == 'N' || value[2] == 'n') && //
        (value[3] == 'O' || value[3] == 'o') && //
        (value[4] == 'R' || value[4] == 'r') && //
        (value[5] == 'E' || value[5] == 'e');
    default:
      break;
  }

  return IsNOTFOUND(value);
}